

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conductor.hpp
# Opt level: O0

void __thiscall ConductorBRDF::ConductorBRDF(ConductorBRDF *this,string *name)

{
  bool bVar1;
  __type _Var2;
  undefined8 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  int i;
  bool found;
  int local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  
  __rhs = in_RDI;
  BxDF::BxDF((BxDF *)&in_RDI[1]._M_string_length);
  BRDF::BRDF((BRDF *)in_RDI,&PTR_construction_vtable_24__001e88f8);
  DiracBxDF::DiracBxDF((DiracBxDF *)&in_RDI->_M_string_length,&PTR_construction_vtable_24__001e8908)
  ;
  *(undefined ***)in_RDI = &PTR_sample_f_001e8898;
  in_RDI[1]._M_string_length = (size_type)&PTR_f_001e88e0;
  in_RDI->_M_string_length = (size_type)&PTR_f_001e88b8;
  vec3f::vec3f((vec3f *)&in_RDI->field_2);
  vec3f::vec3f((vec3f *)((long)&in_RDI->field_2 + 0xc));
  *(undefined4 *)((long)&in_RDI->_M_string_length + *(long *)(*(long *)in_RDI + -0x18)) = 3;
  bVar1 = false;
  for (local_18 = 0; local_18 < 0x28; local_18 = local_18 + 1) {
    _Var2 = std::operator==(unaff_retaddr,__rhs);
    if (_Var2) {
      bVar1 = true;
      (in_RDI->field_2)._M_allocated_capacity = *(size_type *)&complexIorList[local_18].eta;
      *(float *)((long)&in_RDI->field_2 + 8) = complexIorList[local_18].eta.z;
      *(undefined8 *)((long)&in_RDI->field_2 + 0xc) = *(undefined8 *)&complexIorList[local_18].k;
      *(float *)&in_RDI[1].field_0x4 = complexIorList[local_18].k.z;
    }
  }
  if (bVar1) {
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "conductor material not found";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

ConductorBRDF(std::string name)
	{
		flags = Type(DIRAC | REFLECT);
		bool found = false;
		for (int i=0; i<ComplexIorCount; ++i)
			if (complexIorList[i].name == name) {
				found = true;
				eta = complexIorList[i].eta;
				k = complexIorList[i].k;
			}
		if (!found) throw "conductor material not found";
	}